

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::TestFactoryImpl<IntrusiveListIteratorTest_crbegin_crend_backward_Test>::
CreateTest(TestFactoryImpl<IntrusiveListIteratorTest_crbegin_crend_backward_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x30);
  IntrusiveListIteratorTest_crbegin_crend_backward_Test::
  IntrusiveListIteratorTest_crbegin_crend_backward_Test
            ((IntrusiveListIteratorTest_crbegin_crend_backward_Test *)this_00);
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }